

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::PathTypeHandlerBase::TryGetFixedProperty<false,true>
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,Var *pProperty,
          FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  PropertyIndex index;
  int iVar3;
  undefined4 extraout_var;
  RecyclableObject *obj;
  undefined4 *puVar4;
  
  if (DAT_015bf361 == '\x01') {
    index = TypePath::Lookup((this->typePath).ptr,propertyRecord->pid,
                             (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
    if (index == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xcec,"(allowNonExistent)",
                                  "Trying to get a fixed function instance for a non-existent property?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    else {
      iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
      if ((((CONCAT44(extraout_var,iVar3) == 0) ||
           ((*(byte *)(CONCAT44(extraout_var,iVar3) + (ulong)index) & 0x18) == 0)) &&
          (obj = (RecyclableObject *)
                 TypePath::GetSingletonFixedFieldAt
                           ((this->typePath).ptr,index,
                            (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),requestContext
                           ), obj != (RecyclableObject *)0x0)) &&
         ((((bVar2 = DynamicTypeHandler::IsFixedMethodProperty
                               (&this->super_DynamicTypeHandler,propertyType),
            (ulong)obj >> 0x30 == 0 && (bVar2)) &&
           (bVar2 = VarIsImpl<Js::JavascriptFunction>(obj), bVar2)) ||
          (bVar2 = DynamicTypeHandler::IsFixedDataProperty
                             (&this->super_DynamicTypeHandler,propertyType), bVar2)))) {
        *pProperty = obj;
        TypePath::SetIsUsedFixedFieldAt
                  ((this->typePath).ptr,index,
                   (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool PathTypeHandlerBase::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, Js::FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        if (!FixPropsOnPathTypes())
        {
            return false;
        }

        PropertyIndex index = this->GetTypePath()->Lookup(propertyRecord->GetPropertyId(), GetPathLength());
        if (index == Constants::NoSlot)
        {
            AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            return false;
        }

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;
        if (attr & (ObjectSlotAttr_Deleted | ObjectSlotAttr_Accessor))
        {
            return false;
        }

        Var value = this->GetTypePath()->GetSingletonFixedFieldAt(index, GetPathLength(), requestContext);
        if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
        {
            *pProperty = value;
            if (markAsUsed)
            {
                this->GetTypePath()->SetIsUsedFixedFieldAt(index, GetPathLength());
            }
            return true;
        }
        else
        {
            return false;
        }
    }